

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_mq.c
# Opt level: O3

void skynet_globalmq_push(message_queue *queue)

{
  int iVar1;
  global_queue *pgVar2;
  global_queue *pgVar3;
  
  pgVar2 = Q;
  do {
    LOCK();
    iVar1 = (pgVar2->lock).lock;
    (pgVar2->lock).lock = 1;
    UNLOCK();
  } while (iVar1 != 0);
  if (queue->next == (message_queue *)0x0) {
    pgVar3 = (global_queue *)&pgVar2->tail->next;
    if (pgVar2->tail == (message_queue *)0x0) {
      pgVar3 = pgVar2;
    }
    pgVar3->head = queue;
    pgVar2->tail = queue;
    (pgVar2->lock).lock = 0;
    return;
  }
  __assert_fail("queue->next == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_mq.c"
                ,0x30,"void skynet_globalmq_push(struct message_queue *)");
}

Assistant:

void 
skynet_globalmq_push(struct message_queue * queue) {
	struct global_queue *q= Q;

	SPIN_LOCK(q)
	assert(queue->next == NULL);
	if(q->tail) {
		q->tail->next = queue;
		q->tail = queue;
	} else {
		q->head = q->tail = queue;
	}
	SPIN_UNLOCK(q)
}